

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Entity_State_PDU::Entity_State_PDU(Entity_State_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_002250a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID);
  this->m_ui8ForceID = '\0';
  this->m_ui8NumOfVariableParams = '\0';
  DATA_TYPE::EntityType::EntityType(&this->m_EntityType);
  DATA_TYPE::EntityType::EntityType(&this->m_AltEntityType);
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearVelocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_EntityLocation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_EntityOrientation);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EntityAppearance);
  DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter(&this->m_DeadReckoningParameter);
  DATA_TYPE::EntityMarking::EntityMarking(&this->m_EntityMarking);
  DATA_TYPE::EntityCapabilities::EntityCapabilities(&this->m_EntityCapabilities);
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_pDrCalc = (DeadReckoningCalculator *)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x01';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x90;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU() :
    m_ui8NumOfVariableParams( 0 ),
    m_ui8ForceID( 0 ),
    m_pDrCalc( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Entity_State_PDU_Type;
    m_ui16PDULength = ENTITY_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}